

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * qUncompress(QByteArray *__return_storage_ptr__,uchar *data,qsizetype nbytes)

{
  uint uVar1;
  function_ref<int_(z_stream_s_*)_const> init;
  function_ref<int_(z_stream_s_*,_unsigned_long)_const> processChunk;
  function_ref<void_(z_stream_s_*)_const> deinit;
  char *__old_val;
  ulong capacity;
  long in_FS_OFFSET;
  QByteArrayView input;
  undefined1 local_99;
  BoundEntityType local_98;
  code *pcStack_90;
  undefined1 local_81;
  BoundEntityType local_80;
  code *pcStack_78;
  undefined1 local_69;
  BoundEntityType local_68;
  code *pcStack_60;
  pair<QTypedArrayData<char>_*,_char_*> local_58;
  qsizetype local_48;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (data == (uchar *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      dataIsNull(__return_storage_ptr__,Decompression);
      return __return_storage_ptr__;
    }
  }
  else if (nbytes < 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      lengthIsNegative(__return_storage_ptr__,Decompression);
      return __return_storage_ptr__;
    }
  }
  else {
    if (3 < (ulong)nbytes) {
      uVar1 = *(uint *)data;
      if (nbytes != 4) {
        capacity = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                          uVar1 << 0x18);
        if (capacity <= (ulong)nbytes) {
          capacity = nbytes;
        }
        local_58 = QTypedArrayData<char>::allocate(capacity,KeepSize);
        local_40.d = (Data *)0x0;
        local_48 = 0;
        local_40.ptr = (char *)0x0;
        local_40.size = 0;
        local_68.obj = &local_69;
        pcStack_60 = anon_func::anon_class_1_0_00000001::__invoke;
        local_80.obj = &local_81;
        pcStack_78 = anon_func::anon_class_1_0_00000001::__invoke;
        local_98.obj = &local_99;
        pcStack_90 = anon_func::anon_class_1_0_00000001::__invoke;
        init.super_function_ref_base<false,_const_void,_int,_z_stream_s_*>.m_thunk_ptr =
             anon_func::anon_class_1_0_00000001::__invoke;
        init.super_function_ref_base<false,_const_void,_int,_z_stream_s_*>.m_bound_entity.obj =
             local_68.obj;
        processChunk.super_function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>.
        m_thunk_ptr = anon_func::anon_class_1_0_00000001::__invoke;
        processChunk.super_function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>.
        m_bound_entity.obj = local_80.obj;
        deinit.super_function_ref_base<false,_const_void,_void,_z_stream_s_*>.m_thunk_ptr =
             anon_func::anon_class_1_0_00000001::__invoke;
        deinit.super_function_ref_base<false,_const_void,_void,_z_stream_s_*>.m_bound_entity.obj =
             local_98.obj;
        input.m_data = (storage_type *)(data + 4);
        input.m_size = nbytes + -4;
        xxflate(__return_storage_ptr__,Decompression,(QArrayDataPointer<char> *)&local_58,input,init
                ,processChunk,deinit);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          return __return_storage_ptr__;
        }
        goto LAB_002d0e31;
      }
      if (uVar1 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char *)0x0;
          (__return_storage_ptr__->d).size = 0;
          return __return_storage_ptr__;
        }
        goto LAB_002d0e31;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      invalidCompressedData();
      return __return_storage_ptr__;
    }
  }
LAB_002d0e31:
  __stack_chk_fail();
}

Assistant:

QByteArray qUncompress(const uchar* data, qsizetype nbytes)
{
    if (!data)
        return dataIsNull(ZLibOp::Decompression);

    if (nbytes < 0)
        return lengthIsNegative(ZLibOp::Decompression);

    constexpr qsizetype HeaderSize = sizeof(CompressSizeHint_t);
    if (nbytes < HeaderSize)
        return invalidCompressedData();

    const auto expectedSize = qFromBigEndian<CompressSizeHint_t>(data);
    if (nbytes == HeaderSize) {
        if (expectedSize != 0)
            return invalidCompressedData();
        return QByteArray();
    }

    constexpr auto MaxDecompressedSize = size_t(QByteArray::maxSize());
    if constexpr (MaxDecompressedSize < std::numeric_limits<CompressSizeHint_t>::max()) {
        if (expectedSize > MaxDecompressedSize)
            return tooMuchData(ZLibOp::Decompression);
    }

    // expectedSize may be truncated, so always use at least nbytes
    // (larger by at most 1%, according to zlib docs)
    qsizetype capacity = std::max(qsizetype(expectedSize), // cannot overflow!
                                  nbytes);

    QArrayDataPointer<char> d(capacity);
    return xxflate(ZLibOp::Decompression, std::move(d), {data + HeaderSize, nbytes - HeaderSize},
                   [] (z_stream *zs) { return inflateInit(zs); },
                   [] (z_stream *zs, size_t) { return inflate(zs, Z_NO_FLUSH); },
                   [] (z_stream *zs) { inflateEnd(zs); });
}